

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O0

void __thiscall
SQOuterVar::SQOuterVar(SQOuterVar *this,SQObjectPtr *name,SQObjectPtr *src,SQOuterType t)

{
  undefined4 in_ECX;
  undefined4 *in_RDI;
  SQObjectPtr *this_00;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 2));
  this_00 = (SQObjectPtr *)(in_RDI + 6);
  ::SQObjectPtr::SQObjectPtr(this_00);
  ::SQObjectPtr::operator=(in_stack_ffffffffffffffd0,this_00);
  ::SQObjectPtr::operator=(in_stack_ffffffffffffffd0,this_00);
  *in_RDI = in_ECX;
  return;
}

Assistant:

SQOuterVar(const SQObjectPtr &name,const SQObjectPtr &src,SQOuterType t)
    {
        _name = name;
        _src=src;
        _type=t;
    }